

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl.c
# Opt level: O0

int yajl_config(yajl_handle h,yajl_option opt,...)

{
  uint in_ESI;
  long in_RDI;
  va_list ap;
  int rv;
  int local_c8;
  int local_10;
  
  if ((((in_ESI - 1 < 2) || (in_ESI == 4)) || (in_ESI == 8)) || (in_ESI == 0x10)) {
    local_10 = 1;
    if (local_c8 == 0) {
      *(uint *)(in_RDI + 0x70) = (in_ESI ^ 0xffffffff) & *(uint *)(in_RDI + 0x70);
    }
    else {
      *(uint *)(in_RDI + 0x70) = in_ESI | *(uint *)(in_RDI + 0x70);
    }
  }
  else {
    local_10 = 0;
  }
  return local_10;
}

Assistant:

int
yajl_config(yajl_handle h, yajl_option opt, ...)
{
    int rv = 1;
    va_list ap;
    va_start(ap, opt);

    switch(opt) {
        case yajl_allow_comments:
        case yajl_dont_validate_strings:
        case yajl_allow_trailing_garbage:
        case yajl_allow_multiple_values:
        case yajl_allow_partial_values:
            if (va_arg(ap, int)) h->flags |= opt;
            else h->flags &= ~opt;
            break;
        default:
            rv = 0;
    }
    va_end(ap);

    return rv;
}